

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-type.cpp
# Opt level: O0

ostream * __thiscall wasm::operator<<(wasm *this,ostream *os,Signature sig)

{
  ostream *poVar1;
  TypePrinter local_a8;
  wasm *local_20;
  ostream *os_local;
  Signature sig_local;
  
  sig_local.params = sig.params.id;
  local_20 = this;
  os_local = os;
  anon_unknown_0::TypePrinter::TypePrinter(&local_a8,(ostream *)this);
  poVar1 = anon_unknown_0::TypePrinter::print(&local_a8,(Signature *)&os_local);
  anon_unknown_0::TypePrinter::~TypePrinter(&local_a8);
  return poVar1;
}

Assistant:

std::ostream& operator<<(std::ostream& os, Signature sig) {
  return TypePrinter(os).print(sig);
}